

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

bool __thiscall DIntermissionScreen::CheckOverlay(DIntermissionScreen *this,int i)

{
  bool bVar1;
  PClass *base;
  FName local_c;
  
  local_c.Index = (this->mOverlays).Array[i].mCondition.Index;
  bVar1 = true;
  if (local_c.Index != 0) {
    if ((local_c.Index != 0x236) || (multiplayer)) {
      if (multiplayer) {
        return false;
      }
      if (players == (DObject *)0x0) {
        return false;
      }
      base = PClass::FindClass(&local_c);
      if ((base != (PClass *)0x0) && (bVar1 = DObject::IsKindOf(players,base), bVar1)) {
        return true;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DIntermissionScreen::CheckOverlay(int i)
{
	if (mOverlays[i].mCondition == NAME_Multiplayer && !multiplayer) return false;
	else if (mOverlays[i].mCondition != NAME_None)
	{
		if (multiplayer || players[0].mo == NULL) return false;
		const PClass *cls = PClass::FindClass(mOverlays[i].mCondition);
		if (cls == NULL) return false;
		if (!players[0].mo->IsKindOf(cls)) return false;
	}
	return true;
}